

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOLinker::ScanDependencies
          (cmBinUtilsMacOSMachOLinker *this,string *file,TargetType type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  string executablePath;
  string executableFile;
  string local_88;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (type == EXECUTABLE) {
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  else {
    cmRuntimeDependencyArchive::GetBundleExecutable_abi_cxx11_
              (&local_88,(this->super_cmBinUtilsLinker).Archive);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar2 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar2;
  if (local_68._M_string_length != 0) {
    cmsys::SystemTools::GetFilenamePath(&local_48,&local_68);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = ScanDependencies(this,file,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType type)
{
  std::string executableFile;
  if (type == cmStateEnums::EXECUTABLE) {
    executableFile = file;
  } else {
    executableFile = this->Archive->GetBundleExecutable();
  }
  std::string executablePath;
  if (!executableFile.empty()) {
    executablePath = cmSystemTools::GetFilenamePath(executableFile);
  }
  return this->ScanDependencies(file, executablePath);
}